

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::TemplatedGetItem<Js::RecyclableObject>
               (RecyclableObject *obj,uint64 index,Var *element,ScriptContext *scriptContext,
               bool checkHasItem)

{
  RecyclableObject *pRVar1;
  code *pcVar2;
  uint64 uVar3;
  bool bVar4;
  PropertyId PVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  _func_int **pp_Var8;
  JavascriptLibrary *this;
  RecyclableObject *pRVar9;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *pSStack_30;
  bool checkHasItem_local;
  ScriptContext *scriptContext_local;
  Var *element_local;
  uint64 index_local;
  RecyclableObject *obj_local;
  
  propertyRecord._7_1_ = checkHasItem;
  pSStack_30 = scriptContext;
  scriptContext_local = (ScriptContext *)element;
  element_local = (Var *)index;
  index_local = (uint64)obj;
  bVar4 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(obj);
  if (((bVar4) ||
      (bVar4 = VirtualTableInfo<Js::JavascriptNativeIntArray>::HasVirtualTable((void *)index_local),
      bVar4)) ||
     (bVar4 = VirtualTableInfo<Js::JavascriptNativeFloatArray>::HasVirtualTable((void *)index_local)
     , bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x101d,
                                "(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj))"
                                ,
                                "!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj)"
                               );
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  Js::JavascriptOperators::GetPropertyIdForInt((uint64)element_local,pSStack_30,&local_40);
  uVar3 = index_local;
  if ((propertyRecord._7_1_ & 1) != 0) {
    PVar5 = PropertyRecord::GetPropertyId(local_40);
    BVar6 = Js::JavascriptOperators::HasProperty((RecyclableObject *)uVar3,PVar5);
    if (BVar6 == 0) {
      return 0;
    }
  }
  uVar3 = index_local;
  PVar5 = PropertyRecord::GetPropertyId(local_40);
  pp_Var8 = (_func_int **)
            Js::JavascriptOperators::GetProperty
                      ((RecyclableObject *)uVar3,PVar5,pSStack_30,(PropertyValueInfo *)0x0);
  (scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var8;
  pRVar1 = (RecyclableObject *)
           (scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo;
  this = ScriptContext::GetLibrary(pSStack_30);
  pRVar9 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  return (uint)(pRVar1 != pRVar9);
}

Assistant:

BOOL JavascriptArray::TemplatedGetItem(RecyclableObject * obj, uint64 index, Var * element, ScriptContext * scriptContext, bool checkHasItem)
    {
        // Note: Sometime cross site array go down this path to get the marshalling
        Assert(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj)
            && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj)
            && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj));
        PropertyRecord const * propertyRecord;
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);

        if (checkHasItem && !JavascriptOperators::HasProperty(obj, propertyRecord->GetPropertyId()))
        {
            return FALSE;
        }

        *element = JavascriptOperators::GetProperty(obj, propertyRecord->GetPropertyId(), scriptContext);
        return *element != scriptContext->GetLibrary()->GetUndefined();
    }